

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::RepeatFun::GetFunctions(void)

{
  LogicalTypeId id;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunction *func;
  pointer function;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  long lVar3;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb6c;
  FunctionNullHandling in_stack_fffffffffffffb78;
  ScalarFunctionSet *bind_lambda;
  allocator_type local_471;
  _func_int **local_470;
  vector<duckdb::ScalarFunction,_true> *local_468;
  LogicalType local_460;
  scalar_function_t local_448;
  scalar_function_t local_428;
  LogicalType local_408 [4];
  vector<duckdb::LogicalType,_true> local_3a8;
  LogicalType local_390;
  LogicalType local_378;
  LogicalType local_360;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_348 [24];
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_460.id_ = VARCHAR;
  local_460.physical_type_ = STRUCT|UINT8;
  local_468 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  local_470 = (_func_int **)&PTR__ScalarFunction_01963628;
  lVar3 = 0;
  do {
    id = (&local_460.id_)[lVar3];
    LogicalType::LogicalType(local_408,id);
    LogicalType::LogicalType(local_408 + 1,BIGINT);
    __l._M_len = 2;
    __l._M_array = local_408;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (local_348,__l,(allocator_type *)(local_408 + 2));
    LogicalType::LogicalType(&local_360,id);
    local_428.super__Function_base._M_functor._8_8_ = 0;
    local_428.super__Function_base._M_functor._M_unused._M_object = RepeatFunction;
    local_428._M_invoker =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_invoke;
    local_428.super__Function_base._M_manager =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
    LogicalType::LogicalType(&local_378,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_378;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffb64;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffb6c;
    ScalarFunction::ScalarFunction
              (&local_208,(vector<duckdb::LogicalType,_true> *)local_348,&local_360,&local_428,
               (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
               (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
               in_stack_fffffffffffffb78,(bind_lambda_function_t)in_RDI);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&local_468->
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_208);
    local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         local_470;
    if (local_208.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.function_info.internal.
                 super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_208.function.super__Function_base._M_manager)
                ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor
                );
    }
    BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
    LogicalType::~LogicalType(&local_378);
    if (local_428.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_428.super__Function_base._M_manager)
                ((_Any_data *)&local_428,(_Any_data *)&local_428,__destroy_functor);
    }
    LogicalType::~LogicalType(&local_360);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_348);
    lVar2 = 0x18;
    do {
      LogicalType::~LogicalType((LogicalType *)(&local_408[0].id_ + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  LogicalType::LogicalType(&local_460,ANY);
  bind_lambda = in_RDI;
  LogicalType::LIST(local_408,&local_460);
  LogicalType::LogicalType(local_408 + 1,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_408;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8,__l_00,
             &local_471);
  LogicalType::LogicalType(local_408 + 2,ANY);
  LogicalType::LIST(local_408 + 3,local_408 + 2);
  local_448.super__Function_base._M_functor._8_8_ = 0;
  local_448.super__Function_base._M_functor._M_unused._M_object = RepeatListFunction;
  local_448._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_448.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_390,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_390;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffb64;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffb6c;
  ScalarFunction::ScalarFunction
            (&local_330,&local_3a8,local_408 + 3,&local_448,RepeatBindFunction,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffffb78,(bind_lambda_function_t)bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&local_468->
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function = local_470;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_390);
  if (local_448.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_448.super__Function_base._M_manager)
              ((_Any_data *)&local_448,(_Any_data *)&local_448,__destroy_functor);
  }
  LogicalType::~LogicalType(local_408 + 3);
  LogicalType::~LogicalType(local_408 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_408[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::~LogicalType(&local_460);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet RepeatFun::GetFunctions() {
	ScalarFunctionSet repeat;
	for (const auto &type : {LogicalType::VARCHAR, LogicalType::BLOB}) {
		repeat.AddFunction(ScalarFunction({type, LogicalType::BIGINT}, type, RepeatFunction));
	}
	repeat.AddFunction(ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::BIGINT},
	                                  LogicalType::LIST(LogicalType::ANY), RepeatListFunction, RepeatBindFunction));
	for (auto &func : repeat.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return repeat;
}